

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::labelNodeOf(BaseBuilder *this,LabelNode **out,uint32_t labelId)

{
  ZoneVector<asmjit::v1_14::LabelNode_*> *this_00;
  CodeHolder *pCVar1;
  Error extraout_EAX;
  Error EVar2;
  Error EVar3;
  LabelNode *pLVar4;
  Error unaff_EBP;
  undefined4 uVar5;
  BaseBuilder *self;
  BaseBuilder *this_01;
  LabelEntry *pLStack_68;
  LabelNode **ppLStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong local_40;
  size_t local_38;
  
  *out = (LabelNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    return 5;
  }
  if (*(uint *)&pCVar1->field_0x100 <= labelId) {
    return 0xc;
  }
  this_00 = &this->_labelNodes;
  self = (BaseBuilder *)out;
  this_01 = this;
  if (*(uint *)&this->field_0x190 <= labelId) {
    self = (BaseBuilder *)&this->_allocator;
    uStack_50 = 0x11725d;
    this_01 = (BaseBuilder *)this_00;
    unaff_EBP = ZoneVectorBase::_resize
                          ((ZoneVectorBase *)this_00,(ZoneAllocator *)self,8,labelId + 1);
    if (unaff_EBP != 0) {
      return unaff_EBP;
    }
  }
  if (labelId < *(uint *)&this->field_0x190) {
    pLVar4 = *(LabelNode **)(*(long *)&this_00->field_0x0 + (ulong)labelId * 8);
    if (pLVar4 != (LabelNode *)0x0) goto LAB_00117284;
    if (*(long *)&this->_allocator == 0) goto LAB_00117332;
    this_01 = (BaseBuilder *)&this->_allocator;
    self = (BaseBuilder *)0x38;
    uStack_50 = 0x1172b4;
    local_40 = (ulong)labelId;
    pLVar4 = (LabelNode *)ZoneAllocator::_alloc((ZoneAllocator *)this_01,0x38,&local_38);
    EVar2 = 0;
    EVar3 = 0;
    if (pLVar4 == (LabelNode *)0x0) goto LAB_00117337;
    *(undefined8 *)pLVar4 = 0;
    *(undefined8 *)(pLVar4 + 8) = 0;
    pLVar4[0x10] = (LabelNode)0x3;
    pLVar4[0x11] = (LabelNode)(this->_nodeFlags | (kActsAsLabel|kHasNoEffect));
    *(undefined8 *)(pLVar4 + 0x12) = 0;
    *(undefined8 *)(pLVar4 + 0x1a) = 0;
    *(undefined8 *)(pLVar4 + 0x20) = 0;
    *(undefined8 *)(pLVar4 + 0x28) = 0;
    *(uint32_t *)(pLVar4 + 0x30) = labelId;
  }
  else {
    uStack_50 = 0x117332;
    labelNodeOf();
LAB_00117332:
    uStack_50 = 0x117337;
    labelNodeOf();
    EVar3 = extraout_EAX;
LAB_00117337:
    EVar2 = EVar3;
    pLVar4 = (LabelNode *)0x0;
  }
  if (pLVar4 == (LabelNode *)0x0) {
    self = (BaseBuilder *)0x1;
    uStack_50 = 0x11734b;
    this_01 = this;
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar2 != 0) {
    return EVar2;
  }
  if (*(uint *)&this->field_0x190 <= labelId) {
    uStack_50 = 0x117357;
    labelNodeOf();
    pCVar1 = (self->super_BaseEmitter)._code;
    uVar5 = 0xffffffff;
    if (((pCVar1 != (CodeHolder *)0x0) &&
        (ppLStack_60 = out, uStack_58 = (ulong)labelId, uStack_50 = (ulong)unaff_EBP,
        EVar3 = CodeHolder::newLabelEntry(pCVar1,&pLStack_68), EVar3 == 0)) &&
       (EVar3 = BaseBuilder_newLabelInternal(self,*(uint32_t *)&pLStack_68->field_0xc), EVar3 == 0))
    {
      uVar5 = *(undefined4 *)&pLStack_68->field_0xc;
    }
    *(undefined4 *)&(this_01->super_BaseEmitter)._vptr_BaseEmitter = 5;
    *(undefined4 *)((long)&(this_01->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar5;
    (this_01->super_BaseEmitter)._emitterType = kNone;
    (this_01->super_BaseEmitter)._emitterFlags = kNone;
    (this_01->super_BaseEmitter)._instructionAlignment = '\0';
    (this_01->super_BaseEmitter)._reservedBaseEmitter = '\0';
    (this_01->super_BaseEmitter)._validationFlags = kNone;
    return (Error)this_01;
  }
  *(LabelNode **)(*(long *)&this_00->field_0x0 + local_40 * 8) = pLVar4;
LAB_00117284:
  *out = pLVar4;
  return 0;
}

Assistant:

Error BaseBuilder::labelNodeOf(LabelNode** out, uint32_t labelId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  uint32_t index = labelId;
  if (ASMJIT_UNLIKELY(index >= _code->labelCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _labelNodes.size())
    ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, index + 1));

  LabelNode* node = _labelNodes[index];
  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<LabelNode>(&node, labelId));
    _labelNodes[index] = node;
  }

  *out = node;
  return kErrorOk;
}